

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O0

UBool MBCSOkForBaseFromUnicode
                (MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  int8_t flag_local;
  UChar32 c_local;
  int32_t length_local;
  uint8_t *bytes_local;
  MBCSData *mbcsData_local;
  
  if ((((flag == '\x02') && (length == 1)) || ((flag == '\x01' && (*bytes == '\0')))) ||
     (((flag < '\x02' && (1 < length)) && (*bytes == '\0')))) {
    mbcsData_local._7_1_ = '\0';
  }
  else if (((mbcsData->utf8Friendly == '\0') || ('\x01' < flag)) ||
          (((int)(uint)mbcsData->utf8Max < c || ((*bytes != '\0' && (flag != '\x01')))))) {
    if ((mbcsData->omitFromU == '\0') || (flag == '\0')) {
      mbcsData_local._7_1_ = '\x01';
    }
    else {
      mbcsData_local._7_1_ = '\0';
    }
  }
  else {
    mbcsData_local._7_1_ = '\0';
  }
  return mbcsData_local._7_1_;
}

Assistant:

U_CFUNC UBool
MBCSOkForBaseFromUnicode(const MBCSData *mbcsData,
                         const uint8_t *bytes, int32_t length,
                         UChar32 c, int8_t flag) {
    /*
     * A 1:1 mapping does not fit into the MBCS base table's fromUnicode table under
     * the following conditions:
     *
     * - a |2 SUB mapping for <subchar1> (no base table data structure for them)
     * - a |1 fallback to 0x00 (result value 0, indistinguishable from unmappable entry)
     * - a multi-byte mapping with leading 0x00 bytes (no explicit length field)
     *
     * Some of these tests are redundant with ucm_mappingType().
     */
    if( (flag==2 && length==1) ||
        (flag==1 && bytes[0]==0) || /* testing length==1 would be redundant with the next test */
        (flag<=1 && length>1 && bytes[0]==0)
    ) {
        return FALSE;
    }

    /*
     * Additional restrictions for UTF-8-friendly fromUnicode tables,
     * for code points up to the maximum optimized one:
     *
     * - any mapping to 0x00 (result value 0, indistinguishable from unmappable entry)
     * - any |1 fallback (no roundtrip flags in the optimized table)
     */
    if(mbcsData->utf8Friendly && flag<=1 && c<=mbcsData->utf8Max && (bytes[0]==0 || flag==1)) {
        return FALSE;
    }

    /*
     * If we omit the fromUnicode data, we can only store roundtrips there
     * because only they are recoverable from the toUnicode data.
     * Fallbacks must go into the extension table.
     */
    if(mbcsData->omitFromU && flag!=0) {
        return FALSE;
    }

    /* All other mappings do fit into the base table. */
    return TRUE;
}